

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_83(QPDF *pdf,char *arg2)

{
  shared_ptr<char> file_buf;
  size_t size;
  QPDFJob j;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  ulong local_50;
  QPDFJob local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  long *local_38 [2];
  long local_28 [2];
  
  QPDFJob::QPDFJob(local_48);
  local_68 = 0;
  p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QUtil::read_file_into_memory(arg2,(shared_ptr *)&local_68,&local_50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"calling initializeFromJson",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,local_68,local_50 + local_68);
  QPDFJob::initializeFromJson((string *)local_48,SUB81(local_38,0));
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"called initializeFromJson",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  return;
}

Assistant:

static void
test_83(QPDF& pdf, char const* arg2)
{
    // Test QPDFJob json with partial = false. For testing with
    // partial = true, we just use qpdf --job-json-file.

    QPDFJob j;
    std::shared_ptr<char> file_buf;
    size_t size;
    QUtil::read_file_into_memory(arg2, file_buf, size);
    try {
        std::cout << "calling initializeFromJson" << std::endl;
        j.initializeFromJson(std::string(file_buf.get(), size));
        std::cout << "called initializeFromJson" << std::endl;
    } catch (QPDFUsage& e) {
        std::cerr << "usage: " << e.what() << std::endl;
    } catch (std::exception& e) {
        std::cerr << "exception: " << e.what() << std::endl;
    }
}